

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::TextureVkImpl::InitializeContentOnHost
          (TextureVkImpl *this,TextureData *InitData,TextureFormatAttribs *FmtAttribs,
          VkImageCreateInfo *ImageCI)

{
  VulkanLogicalDevice *this_00;
  ulong uVar1;
  undefined4 Layout;
  COMPONENT_TYPE ComponentType;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  VkImageLayout VVar5;
  RESOURCE_STATE RVar6;
  RenderDeviceVkImpl *pRVar7;
  VkImageCreateInfo *Args_1;
  uint MipLevel;
  uint uVar8;
  TextureSubResData *pTVar9;
  pointer pVVar10;
  bool bVar11;
  char (*in_stack_ffffffffffffff08) [45];
  Uint32 subres;
  VkImageAspectFlags local_ec;
  TextureVkImpl *local_e8;
  TextureDesc *local_e0;
  uint local_d4;
  Uint32 PixelSize;
  Uint32 ExpectedNumSubresources;
  string msg;
  vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> vkCopyRegions;
  string _msg;
  
  Args_1 = ImageCI;
  local_e8 = this;
  pRVar7 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = (pRVar7->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((this_00->m_EnabledExtFeatures).HostImageCopy.hostImageCopy == 0) {
    FormatString<char[26],char[66]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy",
               (char (*) [66])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14b);
    std::__cxx11::string::~string((string *)&msg);
  }
  ExpectedNumSubresources = ImageCI->arrayLayers * ImageCI->mipLevels;
  if (InitData->NumSubresources != ExpectedNumSubresources) {
    LogError<true,char[48],unsigned_int,char[18],unsigned_int,char[10]>
              (false,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14f,(char (*) [48])"Incorrect number of subresources in init data. ",
               &ExpectedNumSubresources,(char (*) [18])" expected, while ",
               &InitData->NumSubresources,(char (*) [10])0x5d21c4);
  }
  ComponentType = FmtAttribs->ComponentType;
  if (ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[63]>
              (&msg,(char (*) [63])"Initializing depth-stencil texture is currently not supported.")
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x151);
    std::__cxx11::string::~string((string *)&msg);
    ComponentType = FmtAttribs->ComponentType;
  }
  local_ec = ComponentTypeToVkAspectMask(ComponentType);
  std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::vector
            (&vkCopyRegions,(ulong)InitData->NumSubresources,(allocator_type *)&msg);
  subres = 0;
  local_e0 = &(local_e8->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              .m_Desc;
  uVar4 = 0;
  uVar8 = 0;
  do {
    local_d4 = ImageCI->arrayLayers;
    if (local_d4 <= uVar8) {
      msg._M_string_length = 0;
      msg.field_2._8_8_ = 0;
      msg._M_dataplus._M_p = (pointer)0x3b9ee8b6;
      msg.field_2._M_allocated_capacity = (size_type)(local_e8->m_VulkanImage).m_VkObject;
      VVar5 = anon_unknown_102::VkImageLayoutFromUsage(ImageCI->usage);
      msg.field_2._12_4_ = VVar5;
      VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout
                (this_00,(VkHostImageLayoutTransitionInfoEXT *)&msg);
      _msg._M_string_length = 0;
      _msg._M_dataplus._M_p = (pointer)0x3b9ee8b5;
      _msg.field_2._M_allocated_capacity = 0;
      _msg.field_2._8_8_ = (local_e8->m_VulkanImage).m_VkObject;
      Layout = msg.field_2._12_4_;
      VulkanUtilities::VulkanLogicalDevice::CopyMemoryToImage
                (this_00,(VkCopyMemoryToImageInfoEXT *)&_msg);
      RVar6 = VkImageLayoutToResourceState(Layout);
      (local_e8->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RVar6;
LAB_0024fd42:
      bVar11 = local_d4 <= uVar8;
      std::_Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::~_Vector_base
                (&vkCopyRegions.
                  super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>);
      return bVar11;
    }
    for (MipLevel = 0; MipLevel < ImageCI->mipLevels; MipLevel = MipLevel + 1) {
      pTVar9 = InitData->pSubResources + uVar4;
      pVVar10 = vkCopyRegions.
                super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar4;
      GetMipLevelProperties((MipLevelProperties *)&msg,local_e0,MipLevel);
      pVVar10->sType = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY;
      pVVar10->pNext = (void *)0x0;
      pVVar10->pHostPointer = pTVar9->pData;
      bVar2 = FmtAttribs->NumComponents;
      if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        bVar2 = 1;
      }
      PixelSize = (uint)bVar2 * (uint)FmtAttribs->ComponentSize;
      uVar1 = pTVar9->Stride;
      uVar3 = (uint32_t)(uVar1 / PixelSize);
      if (uVar1 % (ulong)PixelSize != 0) {
        FormatString<char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
                  (&_msg,(Diligent *)"Unable to initialize texture \'",(char (*) [31])local_e0,
                   (char **)"\' on host: subresource ",(char (*) [24])&subres,(uint *)" has stride "
                   ,(char (*) [13])&pTVar9->Stride,
                   (unsigned_long *)" that is not multiple of pixel size ",(char (*) [37])&PixelSize
                   ,(uint *)". The content will be initialized on device.",in_stack_ffffffffffffff08
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
        }
LAB_0024fd35:
        std::__cxx11::string::~string((string *)&_msg);
        goto LAB_0024fd42;
      }
      if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        uVar3 = (uint32_t)((FmtAttribs->BlockWidth * uVar1) / (ulong)FmtAttribs->ComponentSize);
      }
      pVVar10->memoryRowLength = uVar3;
      if (pTVar9->DepthStride % uVar1 != 0) {
        FormatString<char[31],char_const*,char[24],unsigned_int,char[19],unsigned_long,char[37],unsigned_long,char[45]>
                  (&_msg,(Diligent *)"Unable to initialize texture \'",(char (*) [31])local_e0,
                   (char **)"\' on host: subresource ",(char (*) [24])&subres,
                   (uint *)" has depth stride ",(char (*) [19])&pTVar9->DepthStride,
                   (unsigned_long *)" that is not multiple of row stride ",
                   (char (*) [37])&pTVar9->Stride,
                   (unsigned_long *)". The content will be initialized on device.",
                   in_stack_ffffffffffffff08);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0024fd35;
      }
      pVVar10->memoryImageHeight =
           (uint32_t)((pTVar9->DepthStride * (ulong)FmtAttribs->BlockHeight) / uVar1);
      (pVVar10->imageSubresource).aspectMask = local_ec;
      (pVVar10->imageSubresource).mipLevel = MipLevel;
      (pVVar10->imageSubresource).baseArrayLayer = uVar8;
      *(undefined8 *)&(pVVar10->imageSubresource).layerCount = 1;
      (pVVar10->imageOffset).y = 0;
      (pVVar10->imageOffset).z = 0;
      *(pointer *)&pVVar10->imageExtent = msg._M_dataplus._M_p;
      (pVVar10->imageExtent).depth = msg.field_2._M_allocated_capacity._0_4_;
      uVar4 = subres + 1;
      subres = uVar4;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool TextureVkImpl::InitializeContentOnHost(const TextureData&          InitData,
                                            const TextureFormatAttribs& FmtAttribs,
                                            const VkImageCreateInfo&    ImageCI) noexcept(false)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    VERIFY_EXPR(LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy);

    Uint32 ExpectedNumSubresources = ImageCI.mipLevels * ImageCI.arrayLayers;
    if (InitData.NumSubresources != ExpectedNumSubresources)
        LOG_ERROR_AND_THROW("Incorrect number of subresources in init data. ", ExpectedNumSubresources, " expected, while ", InitData.NumSubresources, " provided");

    VERIFY(FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL, "Initializing depth-stencil texture is currently not supported.");
    const VkImageAspectFlags aspectMask = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

    std::vector<VkMemoryToImageCopyEXT> vkCopyRegions(InitData.NumSubresources);

    Uint32 subres = 0;
    for (Uint32 layer = 0; layer < ImageCI.arrayLayers; ++layer)
    {
        for (Uint32 mip = 0; mip < ImageCI.mipLevels; ++mip)
        {
            const TextureSubResData& SubResData = InitData.pSubResources[subres];
            VkMemoryToImageCopyEXT&  vkCopyInfo = vkCopyRegions[subres];
            MipLevelProperties       MipInfo    = GetMipLevelProperties(m_Desc, mip);

            vkCopyInfo.sType        = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY_EXT;
            vkCopyInfo.pNext        = nullptr;
            vkCopyInfo.pHostPointer = SubResData.pData;

            const Uint32 PixelSize = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                Uint32{FmtAttribs.ComponentSize} :
                Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
            if ((SubResData.Stride % PixelSize) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has stride ", SubResData.Stride,
                                        " that is not multiple of pixel size ", PixelSize, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryRowLength = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                static_cast<uint32_t>(SubResData.Stride * FmtAttribs.BlockWidth / FmtAttribs.ComponentSize) :
                static_cast<uint32_t>(SubResData.Stride / PixelSize);

            if ((SubResData.DepthStride % SubResData.Stride) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has depth stride ", SubResData.DepthStride,
                                        " that is not multiple of row stride ", SubResData.Stride, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryImageHeight = static_cast<uint32_t>(SubResData.DepthStride * FmtAttribs.BlockHeight / SubResData.Stride);

            vkCopyInfo.imageSubresource.aspectMask     = aspectMask;
            vkCopyInfo.imageSubresource.mipLevel       = mip;
            vkCopyInfo.imageSubresource.baseArrayLayer = layer;
            vkCopyInfo.imageSubresource.layerCount     = 1;

            vkCopyInfo.imageOffset = {0, 0, 0};
            vkCopyInfo.imageExtent = {MipInfo.LogicalWidth, MipInfo.LogicalHeight, MipInfo.Depth};

            ++subres;
        }
    }

    VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo{};
    vkLayoutTransitionInfo.sType     = VK_STRUCTURE_TYPE_HOST_IMAGE_LAYOUT_TRANSITION_INFO_EXT;
    vkLayoutTransitionInfo.image     = m_VulkanImage;
    vkLayoutTransitionInfo.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    vkLayoutTransitionInfo.newLayout = VkImageLayoutFromUsage(ImageCI.usage);

    vkLayoutTransitionInfo.subresourceRange.aspectMask     = aspectMask;
    vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
    vkLayoutTransitionInfo.subresourceRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
    vkLayoutTransitionInfo.subresourceRange.baseMipLevel   = 0;
    vkLayoutTransitionInfo.subresourceRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    LogicalDevice.HostTransitionImageLayout(vkLayoutTransitionInfo);

    VkCopyMemoryToImageInfoEXT vkCopyInfo{};
    vkCopyInfo.sType          = VK_STRUCTURE_TYPE_COPY_MEMORY_TO_IMAGE_INFO_EXT;
    vkCopyInfo.pNext          = nullptr;
    vkCopyInfo.flags          = 0;
    vkCopyInfo.dstImage       = m_VulkanImage;
    vkCopyInfo.dstImageLayout = vkLayoutTransitionInfo.newLayout;
    vkCopyInfo.regionCount    = static_cast<uint32_t>(vkCopyRegions.size());
    vkCopyInfo.pRegions       = vkCopyRegions.data();

    LogicalDevice.CopyMemoryToImage(vkCopyInfo);

    SetState(VkImageLayoutToResourceState(vkCopyInfo.dstImageLayout));

    return true;
}